

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
handle_async_shutdown
          (connection<websocketpp::config::asio_client::transport_config> *this,
          timer_ptr *shutdown_timer,shutdown_handler *callback,error_code *ec)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  undefined1 auVar1 [16];
  undefined3 uVar2;
  bool bVar3;
  duration dVar4;
  error_category *peVar5;
  error_code *__n;
  undefined1 local_40 [8];
  error_category *local_38;
  error_code local_30;
  
  __n = ec;
  _local_40 = boost::asio::error::make_error_code(operation_aborted);
  bVar3 = boost::system::operator==(ec,(error_code *)local_40);
  if ((!bVar3) &&
     (dVar4 = boost::asio::
              basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::expires_from_now((shutdown_timer->
                                 super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr), -1 < dVar4.__r)) {
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::cancel((shutdown_timer->
             super___shared_ptr<boost::asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
    auVar1._12_4_ = 0;
    auVar1._0_12_ = stack0xffffffffffffffc4;
    _local_40 = (error_code)(auVar1 << 0x20);
    peVar5 = (error_category *)std::_V2::system_category();
    local_38 = peVar5;
    if (ec->failed_ == true) {
      local_30 = boost::asio::error::make_error_code(not_connected);
      bVar3 = boost::system::operator==(ec,&local_30);
      if (!bVar3) {
        peVar5 = (error_category *)transport::error::get_category();
        local_40._0_4_ = 2;
        local_38 = peVar5;
        bVar3 = ec->failed_;
        uVar2 = *(undefined3 *)&ec->field_0x5;
        peVar5 = ec->cat_;
        (this->m_tec).val_ = ec->val_;
        (this->m_tec).failed_ = bVar3;
        *(undefined3 *)&(this->m_tec).field_0x5 = uVar2;
        (this->m_tec).cat_ = peVar5;
        log_err<boost::system::error_code>(this,4,"asio async_shutdown",ec);
      }
    }
    else {
      this_00 = (this->m_alog).
                super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if ((this_00->m_static_channels & 0x400) != 0) {
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (this_00,0x400,"asio con handle_async_shutdown",(size_t)__n);
      }
    }
    std::function<void_(const_std::error_code_&)>::operator()(callback,(error_code *)local_40);
    return;
  }
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"async_shutdown cancelled",(size_t)__n);
  return;
}

Assistant:

void handle_async_shutdown(timer_ptr shutdown_timer, shutdown_handler
        callback, lib::asio::error_code const & ec)
    {
        if (ec == lib::asio::error::operation_aborted ||
            lib::asio::is_neg(shutdown_timer->expires_from_now()))
        {
            m_alog->write(log::alevel::devel,"async_shutdown cancelled");
            return;
        }

        shutdown_timer->cancel();

        lib::error_code tec;
        if (ec) {
            if (ec == lib::asio::error::not_connected) {
                // The socket was already closed when we tried to close it. This
                // happens periodically (usually if a read or write fails
                // earlier and if it is a real error will be caught at another
                // level of the stack.
            } else {
                // We don't know anything more about this error, give our
                // socket/security policy a crack at it.
                tec = socket_con_type::translate_ec(ec);
                m_tec = ec;

                // all other errors are effectively pass through errors of
				// some sort so print some detail on the info channel for
				// library users to look up if needed.
				log_err(log::elevel::info,"asio async_shutdown",ec);
            }
        } else {
            if (m_alog->static_test(log::alevel::devel)) {
                m_alog->write(log::alevel::devel,
                    "asio con handle_async_shutdown");
            }
        }
        callback(tec);
    }